

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O1

int __thiscall
NetOptimize::replace_convolution_with_innerproduct_after_global_pooling(NetOptimize *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer *ppMVar2;
  undefined8 *puVar3;
  undefined4 uVar4;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvVar5;
  Layer *pLVar6;
  int *piVar7;
  void *pvVar8;
  long *plVar9;
  pointer pMVar10;
  pointer pMVar11;
  undefined8 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  pointer piVar15;
  size_type sVar16;
  int iVar17;
  int iVar18;
  Layer *pLVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  ParamDict pd;
  ParamDict local_40;
  
  pvVar5 = (this->super_ModelWriter).layers;
  lVar22 = (long)(pvVar5->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(pvVar5->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_start;
  if (lVar22 != 0) {
    uVar23 = lVar22 >> 3;
    lVar22 = 0;
    do {
      iVar17 = std::__cxx11::string::compare
                         ((char *)&(((this->super_ModelWriter).layers)->
                                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                   )._M_impl.super__Vector_impl_data._M_start[lVar22]->type);
      if ((iVar17 == 0) &&
         (pLVar19 = (((this->super_ModelWriter).layers)->
                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar22],
         *(int *)((long)&pLVar19[1].userdata + 4) != 0)) {
        uVar20 = lVar22 + 1;
        uVar21 = uVar20;
        if (uVar20 < uVar23) {
          iVar17 = *(pLVar19->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          do {
            iVar18 = std::__cxx11::string::compare
                               ((char *)&(((this->super_ModelWriter).layers)->
                                         super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                         )._M_impl.super__Vector_impl_data._M_start[uVar20]->type);
            if (((iVar18 == 0) &&
                (pLVar6 = (((this->super_ModelWriter).layers)->
                          super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                          .super__Vector_impl_data._M_start[uVar20],
                piVar7 = (pLVar6->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start,
                (long)(pLVar6->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)piVar7 == 4)) &&
               (uVar21 = uVar20, *piVar7 == iVar17)) break;
            uVar20 = uVar20 + 1;
            uVar21 = uVar23;
          } while (uVar20 < uVar23);
        }
        if (uVar21 != uVar23) {
          pLVar6 = (((this->super_ModelWriter).layers)->
                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar21];
          fprintf(_stderr,"replace_convolution_with_innerproduct_after_global_pooling %s %s\n",
                  (pLVar19->name)._M_dataplus._M_p,(pLVar6->name)._M_dataplus._M_p);
          pLVar19 = ncnn::create_layer("InnerProduct");
          std::__cxx11::string::_M_replace
                    ((ulong)&pLVar19->type,0,(char *)(pLVar19->type)._M_string_length,0x3234b7);
          std::__cxx11::string::_M_assign((string *)&pLVar19->name);
          std::vector<int,_std::allocator<int>_>::operator=(&pLVar19->bottoms,&pLVar6->bottoms);
          std::vector<int,_std::allocator<int>_>::operator=(&pLVar19->tops,&pLVar6->tops);
          ncnn::ParamDict::ParamDict(&local_40);
          (*pLVar19->_vptr_Layer[2])(pLVar19,&local_40);
          *(undefined4 *)&pLVar19[1]._vptr_Layer = *(undefined4 *)&pLVar6[1]._vptr_Layer;
          *(pointer *)((long)&pLVar19[1]._vptr_Layer + 4) = pLVar6[1].type._M_dataplus._M_p;
          uVar4 = (undefined4)pLVar6[1].type._M_string_length;
          pLVar19[1].support_bf16_storage = (bool)(char)uVar4;
          pLVar19[1].support_fp16_storage = (bool)(char)((uint)uVar4 >> 8);
          pLVar19[1].support_int8_storage = (bool)(char)((uint)uVar4 >> 0x10);
          pLVar19[1].support_image_storage = (bool)(char)((uint)uVar4 >> 0x18);
          paVar1 = &pLVar19[1].name.field_2;
          if (paVar1 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)&pLVar6[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish) {
            piVar7 = pLVar6[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
            if (piVar7 != (int *)0x0) {
              LOCK();
              *piVar7 = *piVar7 + 1;
              UNLOCK();
            }
            piVar7 = *(int **)((long)&pLVar19[1].name.field_2 + 8);
            if (piVar7 != (int *)0x0) {
              LOCK();
              *piVar7 = *piVar7 + -1;
              UNLOCK();
              if (*piVar7 == 0) {
                pvVar8 = (void *)pLVar19[1].name.field_2._M_allocated_capacity;
                plVar9 = (long *)pLVar19[1].bottoms.super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage;
                if (plVar9 == (long *)0x0) {
                  if (pvVar8 != (void *)0x0) {
                    free(pvVar8);
                  }
                }
                else {
                  (**(code **)(*plVar9 + 0x18))();
                }
              }
            }
            pLVar19[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            *(undefined8 *)((long)&pLVar19[1].name.field_2 + 0xc) = 0;
            *(undefined8 *)
             ((long)&pLVar19[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start + 4) = 0;
            paVar1->_M_allocated_capacity = 0;
            *(undefined8 *)((long)&pLVar19[1].name.field_2 + 8) = 0;
            pLVar19[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            pLVar19[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            *(undefined4 *)
             &pLVar19[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = 0;
            piVar15 = pLVar6[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
            pLVar19[1].name.field_2._M_allocated_capacity =
                 (size_type)
                 pLVar6[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            *(pointer *)((long)&pLVar19[1].name.field_2 + 8) = piVar15;
            pLVar19[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start =
                 *(pointer *)
                  &pLVar6[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                   ._M_impl.super__Vector_impl_data;
            *(undefined4 *)
             &pLVar19[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                 *(undefined4 *)
                  &pLVar6[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
            pLVar19[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 (pointer)pLVar6[1].bottom_shapes.
                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage;
            uVar4 = *(undefined4 *)
                     ((long)&pLVar6[1].top_shapes.
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                             super__Vector_impl_data._M_start + 4);
            uVar13 = *(undefined4 *)
                      &pLVar6[1].top_shapes.
                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            uVar14 = *(undefined4 *)
                      ((long)&pLVar6[1].top_shapes.
                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                              super__Vector_impl_data._M_finish + 4);
            *(undefined4 *)
             &pLVar19[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start =
                 *(undefined4 *)
                  &pLVar6[1].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                   _M_impl.super__Vector_impl_data;
            *(undefined4 *)
             ((long)&pLVar19[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start + 4) = uVar4;
            *(undefined4 *)
             &pLVar19[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = uVar13;
            *(undefined4 *)
             ((long)&pLVar19[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 4) = uVar14;
            *(undefined4 *)
             &pLVar19[1].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                 *(undefined4 *)
                  &pLVar6[1].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
            pLVar19[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)pLVar6[2]._vptr_Layer;
          }
          ppMVar2 = &pLVar19[1].bottom_shapes.
                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          if (ppMVar2 != (pointer *)&pLVar6[2].one_blob_only) {
            piVar7 = *(int **)&pLVar6[2].support_tensor_storage;
            if (piVar7 != (int *)0x0) {
              LOCK();
              *piVar7 = *piVar7 + 1;
              UNLOCK();
            }
            pMVar10 = pLVar19[1].bottom_shapes.
                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage;
            if (pMVar10 != (pointer)0x0) {
              LOCK();
              *(int *)&pMVar10->data = *(int *)&pMVar10->data + -1;
              UNLOCK();
              if (*(int *)&pMVar10->data == 0) {
                pMVar10 = pLVar19[1].bottom_shapes.
                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                          super__Vector_impl_data._M_finish;
                pMVar11 = pLVar19[1].top_shapes.
                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage;
                if (pMVar11 == (pointer)0x0) {
                  if (pMVar10 != (pointer)0x0) {
                    free(pMVar10);
                  }
                }
                else {
                  (**(code **)((long)pMVar11->data + 0x18))();
                }
              }
            }
            pLVar19[2].support_reserved_6 = false;
            pLVar19[2].support_reserved_7 = false;
            pLVar19[2].support_reserved_8 = false;
            pLVar19[2].support_reserved_9 = false;
            pLVar19[2].support_reserved_10 = false;
            pLVar19[2].support_reserved_11 = false;
            pLVar19[2].support_reserved_12 = false;
            pLVar19[2].support_reserved_13 = false;
            *(undefined8 *)
             ((long)&pLVar19[1].bottom_shapes.
                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4) = 0;
            *(undefined8 *)
             ((long)&pLVar19[1].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                     ._M_impl.super__Vector_impl_data._M_start + 4) = 0;
            *ppMVar2 = (pointer)0x0;
            pLVar19[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            pLVar19[2]._vptr_Layer = (_func_int **)0x0;
            pLVar19[2].one_blob_only = false;
            pLVar19[2].support_inplace = false;
            pLVar19[2].support_vulkan = false;
            pLVar19[2].support_packing = false;
            pLVar19[2].support_bf16_storage = false;
            pLVar19[2].support_fp16_storage = false;
            pLVar19[2].support_int8_storage = false;
            pLVar19[2].support_image_storage = false;
            pLVar19[2].support_tensor_storage = false;
            pLVar19[2].support_weight_fp16_storage = false;
            pLVar19[2].support_reserved_0 = false;
            pLVar19[2].support_reserved_1 = false;
            pMVar10 = *(pointer *)&pLVar6[2].support_tensor_storage;
            pLVar19[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
            _M_impl.super__Vector_impl_data._M_finish = *(pointer *)&pLVar6[2].one_blob_only;
            pLVar19[1].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = pMVar10;
            pLVar19[1].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_start = *(pointer *)&pLVar6[2].support_reserved_6;
            *(undefined4 *)
             &pLVar19[1].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
              _M_impl.super__Vector_impl_data._M_finish = *(undefined4 *)&pLVar6[2].userdata;
            pLVar19[1].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = *(pointer *)&pLVar6[2].typeindex;
            uVar4 = *(undefined4 *)((long)&pLVar6[2].type._M_dataplus._M_p + 4);
            uVar13 = (undefined4)pLVar6[2].type._M_string_length;
            uVar14 = *(undefined4 *)((long)&pLVar6[2].type._M_string_length + 4);
            *(undefined4 *)&pLVar19[2]._vptr_Layer = *(undefined4 *)&pLVar6[2].type._M_dataplus._M_p
            ;
            *(undefined4 *)((long)&pLVar19[2]._vptr_Layer + 4) = uVar4;
            pLVar19[2].one_blob_only = (bool)(char)uVar13;
            pLVar19[2].support_inplace = (bool)(char)((uint)uVar13 >> 8);
            pLVar19[2].support_vulkan = (bool)(char)((uint)uVar13 >> 0x10);
            pLVar19[2].support_packing = (bool)(char)((uint)uVar13 >> 0x18);
            pLVar19[2].support_bf16_storage = (bool)(char)uVar14;
            pLVar19[2].support_fp16_storage = (bool)(char)((uint)uVar14 >> 8);
            pLVar19[2].support_int8_storage = (bool)(char)((uint)uVar14 >> 0x10);
            pLVar19[2].support_image_storage = (bool)(char)((uint)uVar14 >> 0x18);
            uVar4 = *(undefined4 *)&pLVar6[2].type.field_2;
            pLVar19[2].support_tensor_storage = (bool)(char)uVar4;
            pLVar19[2].support_weight_fp16_storage = (bool)(char)((uint)uVar4 >> 8);
            pLVar19[2].support_reserved_0 = (bool)(char)((uint)uVar4 >> 0x10);
            pLVar19[2].support_reserved_1 = (bool)(char)((uint)uVar4 >> 0x18);
            uVar12 = *(undefined8 *)((long)&pLVar6[2].type.field_2 + 8);
            pLVar19[2].support_reserved_6 = (bool)(char)uVar12;
            pLVar19[2].support_reserved_7 = (bool)(char)((ulong)uVar12 >> 8);
            pLVar19[2].support_reserved_8 = (bool)(char)((ulong)uVar12 >> 0x10);
            pLVar19[2].support_reserved_9 = (bool)(char)((ulong)uVar12 >> 0x18);
            pLVar19[2].support_reserved_10 = (bool)(char)((ulong)uVar12 >> 0x20);
            pLVar19[2].support_reserved_11 = (bool)(char)((ulong)uVar12 >> 0x28);
            pLVar19[2].support_reserved_12 = (bool)(char)((ulong)uVar12 >> 0x30);
            pLVar19[2].support_reserved_13 = (bool)(char)((ulong)uVar12 >> 0x38);
          }
          if ((string *)&pLVar19[2].userdata != &pLVar6[2].name) {
            piVar7 = (int *)pLVar6[2].name._M_string_length;
            if (piVar7 != (int *)0x0) {
              LOCK();
              *piVar7 = *piVar7 + 1;
              UNLOCK();
            }
            piVar7 = *(int **)&pLVar19[2].typeindex;
            if (piVar7 != (int *)0x0) {
              LOCK();
              *piVar7 = *piVar7 + -1;
              UNLOCK();
              if (*piVar7 == 0) {
                plVar9 = (long *)pLVar19[2].type.field_2._M_allocated_capacity;
                if (plVar9 == (long *)0x0) {
                  if (pLVar19[2].userdata != (void *)0x0) {
                    free(pLVar19[2].userdata);
                  }
                }
                else {
                  (**(code **)(*plVar9 + 0x18))();
                }
              }
            }
            pLVar19[2].name.field_2._M_allocated_capacity = 0;
            *(undefined8 *)&pLVar19[2].field_0x2c = 0;
            *(undefined8 *)((long)&pLVar19[2].type._M_dataplus._M_p + 4) = 0;
            pLVar19[2].userdata = (void *)0x0;
            *(undefined8 *)&pLVar19[2].typeindex = 0;
            *(undefined8 *)((long)&pLVar19[2].type.field_2 + 8) = 0;
            pLVar19[2].name._M_dataplus._M_p = (pointer)0x0;
            *(undefined4 *)&pLVar19[2].name._M_string_length = 0;
            sVar16 = pLVar6[2].name._M_string_length;
            pLVar19[2].userdata = pLVar6[2].name._M_dataplus._M_p;
            *(size_type *)&pLVar19[2].typeindex = sVar16;
            pLVar19[2].type._M_dataplus._M_p = (pointer)pLVar6[2].name.field_2._M_allocated_capacity
            ;
            *(undefined4 *)&pLVar19[2].type._M_string_length =
                 *(undefined4 *)((long)&pLVar6[2].name.field_2 + 8);
            pLVar19[2].type.field_2._M_allocated_capacity =
                 *(size_type *)
                  &pLVar6[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data;
            uVar4 = *(undefined4 *)
                     ((long)&pLVar6[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl
                             .super__Vector_impl_data._M_finish + 4);
            uVar13 = *(undefined4 *)
                      &pLVar6[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
            uVar14 = *(undefined4 *)
                      ((long)&pLVar6[2].bottoms.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage + 4);
            *(undefined4 *)((long)&pLVar19[2].type.field_2 + 8) =
                 *(undefined4 *)
                  &pLVar6[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
            *(undefined4 *)((long)&pLVar19[2].type.field_2 + 0xc) = uVar4;
            *(undefined4 *)&pLVar19[2].name._M_dataplus._M_p = uVar13;
            *(undefined4 *)((long)&pLVar19[2].name._M_dataplus._M_p + 4) = uVar14;
            *(undefined4 *)&pLVar19[2].name._M_string_length =
                 *(undefined4 *)
                  &pLVar6[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data;
            pLVar19[2].name.field_2._M_allocated_capacity =
                 (size_type)
                 pLVar6[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
          }
          puVar3 = (undefined8 *)((long)&pLVar19[2].name.field_2 + 8);
          if ((pointer *)puVar3 !=
              &pLVar6[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage) {
            piVar7 = *(int **)&pLVar6[2].bottom_shapes.
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                               super__Vector_impl_data;
            if (piVar7 != (int *)0x0) {
              LOCK();
              *piVar7 = *piVar7 + 1;
              UNLOCK();
            }
            piVar7 = pLVar19[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if (piVar7 != (int *)0x0) {
              LOCK();
              *piVar7 = *piVar7 + -1;
              UNLOCK();
              if (*piVar7 == 0) {
                pvVar8 = *(void **)((long)&pLVar19[2].name.field_2 + 8);
                plVar9 = (long *)pLVar19[2].tops.super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_start;
                if (plVar9 == (long *)0x0) {
                  if (pvVar8 != (void *)0x0) {
                    free(pvVar8);
                  }
                }
                else {
                  (**(code **)(*plVar9 + 0x18))();
                }
              }
            }
            pLVar19[2].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            *(undefined8 *)
             ((long)&pLVar19[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start + 4) = 0;
            *(undefined8 *)
             ((long)&pLVar19[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 4) = 0;
            *puVar3 = 0;
            pLVar19[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            pLVar19[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            pLVar19[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            *(undefined4 *)
             &pLVar19[2].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
              _M_impl.super__Vector_impl_data._M_start = 0;
            piVar15 = *(pointer *)
                       &pLVar6[2].bottom_shapes.
                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                        super__Vector_impl_data;
            *(pointer *)((long)&pLVar19[2].name.field_2 + 8) =
                 pLVar6[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
            pLVar19[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start = piVar15;
            pLVar19[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 (pointer)pLVar6[2].bottom_shapes.
                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                          super__Vector_impl_data._M_finish;
            *(undefined4 *)
             &pLVar19[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                 *(undefined4 *)
                  &pLVar6[2].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
            pLVar19[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start =
                 *(pointer *)
                  &pLVar6[2].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                   _M_impl.super__Vector_impl_data;
            uVar4 = *(undefined4 *)
                     ((long)&pLVar6[2].top_shapes.
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                             super__Vector_impl_data._M_finish + 4);
            uVar13 = *(undefined4 *)
                      &pLVar6[2].top_shapes.
                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
            uVar14 = *(undefined4 *)
                      ((long)&pLVar6[2].top_shapes.
                              super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage + 4);
            *(undefined4 *)
             &pLVar19[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                 *(undefined4 *)
                  &pLVar6[2].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
            *(undefined4 *)
             ((long)&pLVar19[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 4) = uVar4;
            *(undefined4 *)
             &pLVar19[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = uVar13;
            *(undefined4 *)
             ((long)&pLVar19[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4) = uVar14;
            *(undefined4 *)
             &pLVar19[2].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
              _M_impl.super__Vector_impl_data._M_start = *(undefined4 *)&pLVar6[3]._vptr_Layer;
            pLVar19[2].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
            _M_impl.super__Vector_impl_data._M_finish = *(pointer *)&pLVar6[3].one_blob_only;
          }
          uVar4 = *(undefined4 *)((long)&pLVar6[1].type._M_string_length + 4);
          pLVar19[1].support_tensor_storage = (bool)(char)uVar4;
          pLVar19[1].support_weight_fp16_storage = (bool)(char)((uint)uVar4 >> 8);
          pLVar19[1].support_reserved_0 = (bool)(char)((uint)uVar4 >> 0x10);
          pLVar19[1].support_reserved_1 = (bool)(char)((uint)uVar4 >> 0x18);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&pLVar19[1].support_reserved_6 != &pLVar6[1].type.field_2) {
            piVar7 = *(int **)((long)&pLVar6[1].type.field_2 + 8);
            if (piVar7 != (int *)0x0) {
              LOCK();
              *piVar7 = *piVar7 + 1;
              UNLOCK();
            }
            piVar7 = (int *)pLVar19[1].userdata;
            if (piVar7 != (int *)0x0) {
              LOCK();
              *piVar7 = *piVar7 + -1;
              UNLOCK();
              if (*piVar7 == 0) {
                plVar9 = (long *)pLVar19[1].type._M_string_length;
                if (plVar9 == (long *)0x0) {
                  if (*(void **)&pLVar19[1].support_reserved_6 != (void *)0x0) {
                    free(*(void **)&pLVar19[1].support_reserved_6);
                  }
                }
                else {
                  (**(code **)(*plVar9 + 0x18))();
                }
              }
            }
            pLVar19[1].name._M_string_length = 0;
            *(undefined8 *)((long)&pLVar19[1].userdata + 4) = 0;
            *(undefined8 *)&pLVar19[1].field_0x2c = 0;
            pLVar19[1].support_reserved_6 = false;
            pLVar19[1].support_reserved_7 = false;
            pLVar19[1].support_reserved_8 = false;
            pLVar19[1].support_reserved_9 = false;
            pLVar19[1].support_reserved_10 = false;
            pLVar19[1].support_reserved_11 = false;
            pLVar19[1].support_reserved_12 = false;
            pLVar19[1].support_reserved_13 = false;
            pLVar19[1].userdata = (void *)0x0;
            pLVar19[1].type.field_2._M_allocated_capacity = 0;
            *(undefined8 *)((long)&pLVar19[1].type.field_2 + 8) = 0;
            *(undefined4 *)&pLVar19[1].name._M_dataplus._M_p = 0;
            sVar16 = pLVar6[1].type.field_2._M_allocated_capacity;
            pvVar8 = *(void **)((long)&pLVar6[1].type.field_2 + 8);
            pLVar19[1].support_reserved_6 = (bool)(char)sVar16;
            pLVar19[1].support_reserved_7 = (bool)(char)(sVar16 >> 8);
            pLVar19[1].support_reserved_8 = (bool)(char)(sVar16 >> 0x10);
            pLVar19[1].support_reserved_9 = (bool)(char)(sVar16 >> 0x18);
            pLVar19[1].support_reserved_10 = (bool)(char)(sVar16 >> 0x20);
            pLVar19[1].support_reserved_11 = (bool)(char)(sVar16 >> 0x28);
            pLVar19[1].support_reserved_12 = (bool)(char)(sVar16 >> 0x30);
            pLVar19[1].support_reserved_13 = (bool)(char)(sVar16 >> 0x38);
            pLVar19[1].userdata = pvVar8;
            *(pointer *)&pLVar19[1].typeindex = pLVar6[1].name._M_dataplus._M_p;
            *(int *)&pLVar19[1].type._M_dataplus._M_p = (int)pLVar6[1].name._M_string_length;
            pLVar19[1].type._M_string_length = pLVar6[1].name.field_2._M_allocated_capacity;
            uVar4 = *(undefined4 *)((long)&pLVar6[1].name.field_2 + 0xc);
            uVar13 = *(undefined4 *)
                      &pLVar6[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data;
            uVar14 = *(undefined4 *)
                      ((long)&pLVar6[1].bottoms.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start + 4);
            *(undefined4 *)&pLVar19[1].type.field_2 =
                 *(undefined4 *)((long)&pLVar6[1].name.field_2 + 8);
            *(undefined4 *)((long)&pLVar19[1].type.field_2 + 4) = uVar4;
            *(undefined4 *)((long)&pLVar19[1].type.field_2 + 8) = uVar13;
            *(undefined4 *)((long)&pLVar19[1].type.field_2 + 0xc) = uVar14;
            *(undefined4 *)&pLVar19[1].name._M_dataplus._M_p =
                 *(undefined4 *)
                  &pLVar6[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
            pLVar19[1].name._M_string_length =
                 (size_type)
                 pLVar6[1].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
          }
          (((this->super_ModelWriter).layers)->
          super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
          super__Vector_impl_data._M_start[uVar21] = pLVar19;
          if (pLVar6 != (Layer *)0x0) {
            (*pLVar6->_vptr_Layer[1])(pLVar6);
          }
          ncnn::ParamDict::~ParamDict(&local_40);
        }
      }
      lVar22 = lVar22 + 1;
    } while (lVar22 != uVar23 + (uVar23 == 0));
  }
  return 0;
}

Assistant:

int NetOptimize::replace_convolution_with_innerproduct_after_global_pooling()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "Pooling")
            continue;

        ncnn::Pooling* pooling = (ncnn::Pooling*)layers[i];
        if (pooling->global_pooling == 0)
            continue;

        // Pooling - Convolution
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type != "Convolution")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        ncnn::Convolution* convolution = (ncnn::Convolution*)layers[j];

        fprintf(stderr, "replace_convolution_with_innerproduct_after_global_pooling %s %s\n", pooling->name.c_str(), convolution->name.c_str());

        ncnn::InnerProduct* innerproduct = (ncnn::InnerProduct*)ncnn::create_layer("InnerProduct");

        innerproduct->type = "InnerProduct";
        innerproduct->name = convolution->name;
        innerproduct->bottoms = convolution->bottoms;
        innerproduct->tops = convolution->tops;

        ncnn::ParamDict pd;
        innerproduct->load_param(pd);

        innerproduct->num_output = convolution->num_output;
        innerproduct->bias_term = convolution->bias_term;
        innerproduct->weight_data_size = convolution->weight_data_size;
        innerproduct->int8_scale_term = convolution->int8_scale_term;

        innerproduct->weight_data = convolution->weight_data;
        innerproduct->bias_data = convolution->bias_data;
#if NCNN_INT8
        innerproduct->weight_data_int8_scales = convolution->weight_data_int8_scales;
        innerproduct->bottom_blob_int8_scales = convolution->bottom_blob_int8_scales;
#endif

        innerproduct->activation_type = convolution->activation_type;
        innerproduct->activation_params = convolution->activation_params;

        layers[j] = innerproduct;
        delete convolution;
    }

    return 0;
}